

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O0

void __thiscall
ADE_DEP_DPFSP::stampa(ADE_DEP_DPFSP *this,Permutazione **popolazione,unsigned_short nIndividui)

{
  uint uVar1;
  ostream *poVar2;
  int local_24;
  int local_20;
  int j;
  int i;
  unsigned_short nIndividui_local;
  Permutazione **popolazione_local;
  ADE_DEP_DPFSP *this_local;
  
  for (local_20 = 0; local_20 < (int)(uint)nIndividui; local_20 = local_20 + 1) {
    for (local_24 = 0;
        local_24 < (int)((uint)(this->istanza).lavori + (uint)(this->istanza).fabbriche + -1);
        local_24 = local_24 + 1) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,popolazione[local_20]->individuo[local_24]);
      std::operator<<(poVar2," ");
    }
    poVar2 = std::operator<<((ostream *)&std::cout,":");
    poVar2 = std::operator<<(poVar2,"\t");
    uVar1 = (*(this->super_ADE<Permutazione>)._vptr_ADE[7])(this,popolazione[local_20]);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ADE_DEP_DPFSP::stampa(Permutazione** popolazione, unsigned short nIndividui) {

	for (int i = 0; i < nIndividui; i++) {

		for (int j = 0; j < istanza.lavori + istanza.fabbriche - 1; j++) {
			cout << popolazione[i]->individuo[j] << " ";
		}

		cout << ":" << "\t" << valutaIndividuo(popolazione[i]) << endl;
	}

	cout << endl;
}